

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

bstrList * bsplit(const_bstring str,uchar splitChar)

{
  int iVar1;
  bstrList *__ptr;
  bstring *pptVar2;
  genBstrList g;
  
  if (str == (const_bstring)0x0) {
    return (bstrList *)0x0;
  }
  if (((str->data != (uchar *)0x0) && (-1 < str->slen)) &&
     (__ptr = (bstrList *)malloc(0x10), __ptr != (bstrList *)0x0)) {
    __ptr->mlen = 4;
    g.bl = __ptr;
    pptVar2 = (bstring *)malloc(0x20);
    __ptr->entry = pptVar2;
    if (pptVar2 == (bstring *)0x0) {
      free(__ptr);
    }
    else {
      __ptr->qty = 0;
      g.b = str;
      iVar1 = bsplitcb(str,splitChar,0,bscb,&g);
      if (-1 < iVar1) {
        return g.bl;
      }
      bstrListDestroy(g.bl);
    }
  }
  return (bstrList *)0x0;
}

Assistant:

struct bstrList * bsplit (const_bstring str, unsigned char splitChar) {
struct genBstrList g;

	if (str == NULL || str->data == NULL || str->slen < 0) return NULL;

	g.bl = (struct bstrList *) bstr__alloc (sizeof (struct bstrList));
	if (g.bl == NULL) return NULL;
	g.bl->mlen = 4;
	g.bl->entry = (bstring *) bstr__alloc (g.bl->mlen * sizeof (bstring));
	if (NULL == g.bl->entry) {
		bstr__free (g.bl);
		return NULL;
	}

	g.b = (bstring) str;
	g.bl->qty = 0;
	if (bsplitcb (str, splitChar, 0, bscb, &g) < 0) {
		bstrListDestroy (g.bl);
		return NULL;
	}
	return g.bl;
}